

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O1

axis * __thiscall mpt::convertable::operator_cast_to_axis_(convertable *this)

{
  uint uVar1;
  int iVar2;
  axis *ptr;
  axis *local_10;
  
  uVar1 = mpt_axis_pointer_typeid();
  local_10 = (axis *)0x0;
  if (((int)uVar1 < 1) ||
     (iVar2 = (**this->_vptr_convertable)(this,(ulong)uVar1,&local_10), iVar2 < 0)) {
    local_10 = (axis *)0x0;
  }
  return local_10;
}

Assistant:

mpt::convertable::operator T *()
{
	int type = mpt::type_properties<T *>::id(true);
	T *ptr = 0;
	if ((type <= 0) || (convert(type, &ptr) < 0)) {
		return 0;
	}
	return ptr;
}